

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
duckdb_re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,SparseSet *matches)

{
  bool bVar1;
  const_pointer pcVar2;
  char *pcVar3;
  char *pcVar4;
  DFASearchFailureCallback *pDVar5;
  const_pointer pcVar6;
  size_type sVar7;
  int in_ECX;
  StringPiece *in_RDX;
  DFA *in_RSI;
  Prog *in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  bool *unaff_retaddr;
  char **in_stack_00000008;
  SparseSet *in_stack_00000010;
  bool matched;
  char *ep;
  DFA *dfa;
  bool want_earliest_match;
  bool endmatch;
  bool anchored;
  bool dollar;
  bool caret;
  StringPiece context;
  StringPiece *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff30;
  MatchKind kind_00;
  Prog *in_stack_ffffffffffffff38;
  const_pointer local_b0;
  bool local_99;
  StringPiece local_80;
  StringPiece local_70;
  DFASearchFailure local_5a;
  undefined1 local_59;
  const_pointer local_58;
  DFA *local_50;
  bool local_45;
  byte local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  StringPiece local_40;
  bool local_1;
  
  kind_00 = (MatchKind)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  *(undefined1 *)in_stack_00000008 = 0;
  local_40.data_ = in_RDX->data_;
  local_40.size_ = in_RDX->size_;
  pcVar2 = StringPiece::data(&local_40);
  if (pcVar2 == (const_pointer)0x0) {
    local_40.data_ = &in_RSI->prog_->anchor_start_;
    local_40.size_._0_4_ = in_RSI->kind_;
    local_40.size_._4_1_ = in_RSI->init_failed_;
    local_40.size_._5_3_ = *(undefined3 *)&in_RSI->field_0xd;
  }
  local_41 = anchor_start(in_RDI);
  local_42 = anchor_end(in_RDI);
  if ((in_RDI->reversed_ & 1U) != 0) {
    std::swap<bool>(&local_41,&local_42);
  }
  if ((local_41 & 1U) != 0) {
    pcVar3 = BeginPtr((StringPiece *)0x823cdf);
    pcVar4 = BeginPtr((StringPiece *)0x823cf1);
    if (pcVar3 != pcVar4) {
      return false;
    }
  }
  if ((local_42 & 1U) != 0) {
    pcVar3 = EndPtr(in_stack_ffffffffffffff10);
    pcVar4 = EndPtr(in_stack_ffffffffffffff10);
    if (pcVar3 != pcVar4) {
      return false;
    }
  }
  local_99 = true;
  if (in_ECX != 1) {
    bVar1 = anchor_start(in_RDI);
    local_99 = true;
    if (!bVar1) {
      local_99 = in_R8D == 2;
    }
  }
  local_43 = local_99;
  local_44 = 0;
  if ((in_R8D != 3) && ((in_R8D == 2 || (bVar1 = anchor_end(in_RDI), bVar1)))) {
    local_44 = 1;
    in_R8D = 1;
  }
  local_45 = false;
  if (in_R8D == 3) {
    local_45 = in_stack_00000010 == (SparseSet *)0x0;
  }
  else if ((in_R9 == (undefined8 *)0x0) && ((local_44 & 1) == 0)) {
    local_45 = true;
    in_R8D = 1;
  }
  local_50 = GetDFA(in_stack_ffffffffffffff38,kind_00);
  local_59 = DFA::Search(in_RSI,in_RDX,(StringPiece *)CONCAT44(in_ECX,in_R8D),
                         SUB81((ulong)in_R9 >> 0x38,0),SUB81((ulong)in_R9 >> 0x30,0),
                         SUB81((ulong)in_R9 >> 0x28,0),unaff_retaddr,in_stack_00000008,
                         in_stack_00000010);
  pcVar2 = local_58;
  if (((ulong)*in_stack_00000008 & 1) == 0) {
    if ((bool)local_59) {
      if ((local_44 & 1) != 0) {
        if ((in_RDI->reversed_ & 1U) == 0) {
          local_b0 = StringPiece::data((StringPiece *)in_RSI);
          sVar7 = StringPiece::size((StringPiece *)in_RSI);
          local_b0 = local_b0 + sVar7;
        }
        else {
          local_b0 = StringPiece::data((StringPiece *)in_RSI);
        }
        if (pcVar2 != local_b0) {
          return false;
        }
      }
      pcVar2 = local_58;
      if (in_R9 != (undefined8 *)0x0) {
        if ((in_RDI->reversed_ & 1U) == 0) {
          pcVar2 = StringPiece::data((StringPiece *)in_RSI);
          pcVar6 = StringPiece::data((StringPiece *)in_RSI);
          StringPiece::StringPiece(&local_80,pcVar2,(long)local_58 - (long)pcVar6);
          *in_R9 = local_80.data_;
          in_R9[1] = local_80.size_;
        }
        else {
          pcVar6 = StringPiece::data((StringPiece *)in_RSI);
          sVar7 = StringPiece::size((StringPiece *)in_RSI);
          StringPiece::StringPiece(&local_70,pcVar2,(size_type)(pcVar6 + (sVar7 - (long)local_58)));
          *in_R9 = local_70.data_;
          in_R9[1] = local_70.size_;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    pDVar5 = hooks::GetDFASearchFailureHook();
    (*pDVar5)(&local_5a);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind, StringPiece* match0,
                     bool* failed, SparseSet* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  bool caret = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    using std::swap;
    swap(caret, dollar);
  }
  if (caret && BeginPtr(context) != BeginPtr(text))
    return false;
  if (dollar && EndPtr(context) != EndPtr(text))
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "earliest match".
  bool want_earliest_match = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
    if (matches == NULL) {
      want_earliest_match = true;
    }
  } else if (match0 == NULL && !endmatch) {
    want_earliest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_earliest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed) {
    hooks::GetDFASearchFailureHook()({
        // Nothing yet...
    });
    return false;
  }
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.data() : text.data() + text.size()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      *match0 =
          StringPiece(ep, static_cast<size_t>(text.data() + text.size() - ep));
    else
      *match0 =
          StringPiece(text.data(), static_cast<size_t>(ep - text.data()));
  }
  return true;
}